

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

sftp_request * sftp_find_request(sftp_packet *pktin)

{
  unsigned_long uVar1;
  sftp_request *req;
  sftp_packet *psStack_18;
  uint id;
  sftp_packet *pktin_local;
  
  psStack_18 = pktin;
  if (pktin == (sftp_packet *)0x0) {
    fxp_internal_error("did not receive a valid SFTP packet\n");
    pktin_local = (sftp_packet *)0x0;
  }
  else {
    uVar1 = BinarySource_get_uint32(pktin->binarysource_);
    req._4_4_ = (undefined4)uVar1;
    if (psStack_18->binarysource_[0].err == BSE_NO_ERROR) {
      pktin_local = (sftp_packet *)find234(sftp_requests,(void *)((long)&req + 4),sftp_reqfind);
      if ((pktin_local == (sftp_packet *)0x0) || (((ulong)pktin_local->data & 0x100000000) == 0)) {
        fxp_internal_error("request ID mismatch\n");
        pktin_local = (sftp_packet *)0x0;
      }
      else {
        del234(sftp_requests,pktin_local);
      }
    }
    else {
      fxp_internal_error("did not receive a valid SFTP packet\n");
      pktin_local = (sftp_packet *)0x0;
    }
  }
  return (sftp_request *)pktin_local;
}

Assistant:

struct sftp_request *sftp_find_request(struct sftp_packet *pktin)
{
    unsigned id;
    struct sftp_request *req;

    if (!pktin) {
        fxp_internal_error("did not receive a valid SFTP packet\n");
        return NULL;
    }

    id = get_uint32(pktin);
    if (get_err(pktin)) {
        fxp_internal_error("did not receive a valid SFTP packet\n");
        return NULL;
    }

    req = find234(sftp_requests, &id, sftp_reqfind);
    if (!req || !req->registered) {
        fxp_internal_error("request ID mismatch\n");
        return NULL;
    }

    del234(sftp_requests, req);

    return req;
}